

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

char * cimg_library::cimg::gunzip_path(char *user_path,bool reinit_path)

{
  uint uVar1;
  FILE *__stream;
  
  if (gunzip_path(char_const*,bool)::s_path == '\0') {
    gunzip_path();
  }
  if (Mutex_attr()::val == '\0') {
    gunzip_path();
  }
  pthread_mutex_lock((pthread_mutex_t *)(Mutex_attr()::val + 0x118));
  if (reinit_path) {
    if ((gunzip_path::s_path._is_shared == false) && (gunzip_path::s_path._data != (char *)0x0)) {
      operator_delete__(gunzip_path::s_path._data);
    }
    gunzip_path::s_path._data = (char *)0x0;
    gunzip_path::s_path._width = 0;
    gunzip_path::s_path._height = 0;
    gunzip_path::s_path._depth = 0;
    gunzip_path::s_path._spectrum = 0;
    gunzip_path::s_path._is_shared = false;
  }
  if (user_path == (char *)0x0) {
    if (gunzip_path::s_path._data == (char *)0x0) {
      CImg<char>::assign(&gunzip_path::s_path,0x400,1,1,1);
      builtin_strncpy(gunzip_path::s_path._data,"./gunzip",9);
      __stream = ::fopen(gunzip_path::s_path._data,"r");
      if (__stream == (FILE *)0x0) {
        builtin_strncpy(gunzip_path::s_path._data,"gunzip",7);
      }
      else if ((_stdin != __stream) && (_stdout != __stream)) {
        uVar1 = ::fclose(__stream);
        if (uVar1 != 0) {
          warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar1);
        }
      }
    }
  }
  else {
    if (gunzip_path::s_path._data == (char *)0x0) {
      CImg<char>::assign(&gunzip_path::s_path,0x400,1,1,1);
    }
    strncpy(gunzip_path::s_path._data,user_path,0x3ff);
  }
  if (Mutex_attr()::val == '\0') {
    gunzip_path();
  }
  pthread_mutex_unlock((pthread_mutex_t *)(Mutex_attr()::val + 0x118));
  return gunzip_path::s_path._data;
}

Assistant:

inline const char *gunzip_path(const char *const user_path, const bool reinit_path) {
      static CImg<char> s_path;
      cimg::mutex(7);
      if (reinit_path) s_path.assign();
      if (user_path) {
        if (!s_path) s_path.assign(1024);
        std::strncpy(s_path,user_path,1023);
      } else if (!s_path) {
        s_path.assign(1024);
        bool path_found = false;
        std::FILE *file = 0;
#if cimg_OS==2
        if (!path_found) {
          std::strcpy(s_path,".\\gunzip.exe");
          if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(s_path,"gunzip.exe");
#else
        if (!path_found) {
          std::strcpy(s_path,"./gunzip");
          if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(s_path,"gunzip");
#endif
        winformat_string(s_path);
      }
      cimg::mutex(7,0);
      return s_path;
    }